

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamWriter.h
# Opt level: O0

void __thiscall
Assimp::StreamWriter<false,_false>::StreamWriter
          (StreamWriter<false,_false> *this,shared_ptr<Assimp::IOStream> *stream,bool le)

{
  bool le_local;
  shared_ptr<Assimp::IOStream> *stream_local;
  StreamWriter<false,_false> *this_local;
  
  std::shared_ptr<Assimp::IOStream>::shared_ptr(&this->stream,stream);
  this->le = le;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->buffer);
  this->cursor = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&this->buffer,0x400);
  return;
}

Assistant:

StreamWriter(std::shared_ptr<IOStream> stream, bool le = false)
        : stream(stream)
        , le(le)
        , cursor()
    {
        ai_assert(stream);
        buffer.reserve(INITIAL_CAPACITY);
    }